

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateGenericFunctionPrototype
               (ExpressionTranslateContext *ctx,ExprGenericFunctionPrototype *expression)

{
  SynIdentifier *pSVar1;
  ExprVariableDefinition *expression_00;
  char *format;
  
  pSVar1 = expression->function->name;
  Print(ctx,"/* Definition of generic function prototype \'%.*s\' */",
        (ulong)(uint)(*(int *)&(pSVar1->name).end - (int)(pSVar1->name).begin));
  if ((expression->contextVariables).head == (ExprVariableDefinition *)0x0) {
    format = "0";
  }
  else {
    Print(ctx,"(");
    OutputContext::Print(ctx->output,"\n",1);
    ctx->depth = ctx->depth + 1;
    for (expression_00 = (expression->contextVariables).head;
        expression_00 != (ExprVariableDefinition *)0x0;
        expression_00 = (ExprVariableDefinition *)(expression_00->super_ExprBase).next) {
      PrintIndent(ctx);
      Translate(ctx,&expression_00->super_ExprBase);
      if ((expression_00->super_ExprBase).next != (ExprBase *)0x0) {
        Print(ctx,", ");
      }
      OutputContext::Print(ctx->output,"\n",1);
    }
    ctx->depth = ctx->depth - 1;
    PrintIndent(ctx);
    format = ")";
  }
  Print(ctx,format);
  return;
}

Assistant:

void TranslateGenericFunctionPrototype(ExpressionTranslateContext &ctx, ExprGenericFunctionPrototype *expression)
{
	Print(ctx, "/* Definition of generic function prototype '%.*s' */", FMT_ISTR(expression->function->name->name));

	if(!expression->contextVariables.head)
	{
		Print(ctx, "0");
		return;
	}

	Print(ctx, "(");
	PrintLine(ctx);

	ctx.depth++;

	for(ExprBase *curr = expression->contextVariables.head; curr; curr = curr->next)
	{
		PrintIndent(ctx);

		Translate(ctx, curr);

		if(curr->next)
			Print(ctx, ", ");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, ")");
}